

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

void Ssw_SmlReinitialize(Ssw_Sml_t *p)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pIn;
  int iVar2;
  Aig_Man_t *p_00;
  
  p_00 = p->pAig;
  if (p_00->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x3bf,"void Ssw_SmlReinitialize(Ssw_Sml_t *)");
  }
  if (p_00->nRegs < p_00->nObjs[2]) {
    for (iVar2 = 0; iVar2 < p_00->nTruePis; iVar2 = iVar2 + 1) {
      pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p_00->vCis,iVar2);
      Ssw_SmlAssignRandom(p,pAVar1);
      p_00 = p->pAig;
    }
    for (iVar2 = 0; iVar2 < p_00->nRegs; iVar2 = iVar2 + 1) {
      pAVar1 = Saig_ManLi(p_00,iVar2);
      pIn = Saig_ManLo(p->pAig,iVar2);
      Ssw_SmlNodeTransferFirst(p,pAVar1,pIn);
      p_00 = p->pAig;
    }
    return;
  }
  __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                ,0x3c0,"void Ssw_SmlReinitialize(Ssw_Sml_t *)");
}

Assistant:

void Ssw_SmlReinitialize( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    // assign random info for primary inputs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_SmlAssignRandom( p, pObj );
    // copy simulation info into the inputs
    Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        Ssw_SmlNodeTransferFirst( p, pObjLi, pObjLo );
}